

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
          (SmallVectorImpl<llbuild::buildsystem::BuildKey> *this)

{
  BuildKey *S;
  
  S = (BuildKey *)
      (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      BeginX;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::destroy_range
            (S,S + (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
                   super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                   super_SmallVectorBase.Size);
  (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.Size =
       0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }